

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O3

CSampleHandle __thiscall CSound::LoadWV(CSound *this,char *pFilename)

{
  int iVar1;
  uint32_t samples;
  uint32_t uVar2;
  int iVar3;
  undefined4 extraout_var;
  WavpackContext *wpc;
  int32_t *buffer;
  short *psVar4;
  long lVar5;
  uint SampleID;
  long lVar6;
  CSample *pCVar7;
  long in_FS_OFFSET;
  char aError [100];
  char local_a8 [112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = -1;
  if (((this->m_pConfig->m_DbgStress == 0) && (this->m_SoundEnabled != 0)) &&
     (this->m_pStorage != (IStorage *)0x0)) {
    lock_wait(m_SoundLock);
    lVar6 = 0xffffffff;
    iVar1 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                      (this->m_pStorage,pFilename,1,0xffffffff,0,0,0,0);
    s_File = (IOHANDLE)CONCAT44(extraout_var,iVar1);
    if (s_File == (IOHANDLE)0x0) {
      dbg_msg("sound/wv","failed to open file. filename=\'%s\'",pFilename);
LAB_0012f052:
      iVar1 = (int)lVar6;
      lock_unlock(m_SoundLock);
    }
    else {
      pCVar7 = m_aSamples;
      lVar6 = 0;
      do {
        if (pCVar7->m_pData == (short *)0x0) {
          wpc = WavpackOpenFileInput(ReadDataOld,local_a8);
          if (wpc == (WavpackContext *)0x0) {
            dbg_msg("sound/wv","failed to open %s: %s",pFilename,local_a8);
            goto LAB_0012f00f;
          }
          samples = WavpackGetNumSamples(wpc);
          iVar1 = WavpackGetBitsPerSample(wpc);
          uVar2 = WavpackGetSampleRate(wpc);
          iVar3 = WavpackGetNumChannels(wpc);
          pCVar7->m_Channels = iVar3;
          pCVar7->m_Rate = uVar2;
          if (iVar3 < 3) {
            if (iVar1 == 0x10) {
              iVar3 = iVar3 * samples;
              buffer = (int32_t *)mem_alloc(iVar3 * 4);
              WavpackUnpackSamples(wpc,buffer,samples);
              psVar4 = (short *)mem_alloc(iVar3 * 2);
              pCVar7->m_pData = psVar4;
              if (0 < iVar3) {
                lVar5 = 0;
                do {
                  psVar4[lVar5] = (short)buffer[lVar5];
                  lVar5 = lVar5 + 1;
                } while (iVar3 != (int)lVar5);
              }
              mem_free(buffer);
              pCVar7->m_NumFrames = samples;
              pCVar7->m_LoopStart = -1;
              pCVar7->m_LoopEnd = -1;
              pCVar7->m_PausedAt = 0;
LAB_0012f00f:
              io_close(s_File);
              s_File = (IOHANDLE)0x0;
              if (this->m_pConfig->m_Debug != 0) {
                dbg_msg("sound/wv","loaded %s",pFilename);
              }
              RateConvert((int)lVar6);
              goto LAB_0012f052;
            }
            dbg_msg("sound/wv","bps is %d, not 16, filname=\'%s\'",iVar1,pFilename);
          }
          else {
            dbg_msg("sound/wv","file is not mono or stereo. filename=\'%s\'",pFilename);
          }
          break;
        }
        lVar6 = lVar6 + 1;
        pCVar7 = pCVar7 + 1;
      } while (lVar6 != 0x200);
      io_close(s_File);
      s_File = (IOHANDLE)0x0;
      lock_unlock(m_SoundLock);
      iVar1 = -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (CSampleHandle)iVar1;
}

Assistant:

ISound::CSampleHandle CSound::LoadWV(const char *pFilename)
{
	CSample *pSample;
	int SampleID = -1;
	char aError[100];
	WavpackContext *pContext;

	// don't waste memory on sound when we are stress testing
	if(m_pConfig->m_DbgStress)
		return CSampleHandle();

	// no need to load sound when we are running with no sound
	if(!m_SoundEnabled)
		return CSampleHandle();

	if(!m_pStorage)
		return CSampleHandle();

	lock_wait(m_SoundLock);
	s_File = m_pStorage->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!s_File)
	{
		dbg_msg("sound/wv", "failed to open file. filename='%s'", pFilename);
		lock_unlock(m_SoundLock);
		return CSampleHandle();
	}

	SampleID = AllocID();
	if(SampleID < 0)
	{
		io_close(s_File);
		s_File = 0;
		lock_unlock(m_SoundLock);
		return CSampleHandle();
	}
	pSample = &m_aSamples[SampleID];

#if defined(CONF_WAVPACK_OPEN_FILE_INPUT_EX)
	WavpackStreamReader Callback = {0};
	Callback.can_seek = ReturnFalse;
	Callback.get_length = GetLength;
	Callback.get_pos = GetPos;
	Callback.push_back_byte = PushBackByte;
	Callback.read_bytes = ReadData;
	pContext = WavpackOpenFileInputEx(&Callback, (void *)1, 0, aError, 0, 0);
#else
	pContext = WavpackOpenFileInput(ReadDataOld, aError);
#endif
	if (pContext)
	{
		int m_aSamples = WavpackGetNumSamples(pContext);
		int BitsPerSample = WavpackGetBitsPerSample(pContext);
		unsigned int SampleRate = WavpackGetSampleRate(pContext);
		int m_aChannels = WavpackGetNumChannels(pContext);
		int *pData;
		int *pSrc;
		short *pDst;
		int i;

		pSample->m_Channels = m_aChannels;
		pSample->m_Rate = SampleRate;

		if(pSample->m_Channels > 2)
		{
			dbg_msg("sound/wv", "file is not mono or stereo. filename='%s'", pFilename);
			io_close(s_File);
			s_File = 0;
			lock_unlock(m_SoundLock);
			return CSampleHandle();
		}

		/*
		if(snd->rate != 44100)
		{
			dbg_msg("sound/wv", "file is %d Hz, not 44100 Hz. filename='%s'", snd->rate, filename);
			return -1;
		}*/

		if(BitsPerSample != 16)
		{
			dbg_msg("sound/wv", "bps is %d, not 16, filname='%s'", BitsPerSample, pFilename);
			io_close(s_File);
			s_File = 0;
			lock_unlock(m_SoundLock);
			return CSampleHandle();
		}

		pData = (int *)mem_alloc(4*m_aSamples*m_aChannels);
		WavpackUnpackSamples(pContext, pData, m_aSamples); // TODO: check return value
		pSrc = pData;

		pSample->m_pData = (short *)mem_alloc(2*m_aSamples*m_aChannels);
		pDst = pSample->m_pData;

		for (i = 0; i < m_aSamples*m_aChannels; i++)
			*pDst++ = (short)*pSrc++;

		mem_free(pData);

		pSample->m_NumFrames = m_aSamples;
		pSample->m_LoopStart = -1;
		pSample->m_LoopEnd = -1;
		pSample->m_PausedAt = 0;
	}
	else
	{
		dbg_msg("sound/wv", "failed to open %s: %s", pFilename, aError);
	}

	io_close(s_File);
	s_File = NULL;

	if(m_pConfig->m_Debug)
		dbg_msg("sound/wv", "loaded %s", pFilename);

	RateConvert(SampleID);
	lock_unlock(m_SoundLock);
	return CreateSampleHandle(SampleID);
}